

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericDatum.hh
# Opt level: O0

void __thiscall avro::GenericRecord::~GenericRecord(GenericRecord *this)

{
  vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_> *unaff_retaddr;
  
  std::vector<avro::GenericDatum,_std::allocator<avro::GenericDatum>_>::~vector(unaff_retaddr);
  GenericContainer::~GenericContainer((GenericContainer *)0x1e6946);
  return;
}

Assistant:

class AVRO_DECL GenericRecord : public GenericContainer {
    std::vector<GenericDatum> fields_;
public:
    /**
     * Constructs a generic record corresponding to the given schema \p schema,
     * which should be of Avro type record.
     */
    GenericRecord(const NodePtr& schema);

    /**
     * Returns the number of fields in the current record.
     */
    size_t fieldCount() const {
        return fields_.size();
    }

    /**
     * Returns index of the field with the given name \p name
     */
    size_t fieldIndex(const std::string& name) const { 
        size_t index = 0;
        if (!schema()->nameIndex(name, index)) {
            throw Exception("Invalid field name: " + name);
        }
        return index;
    }

    /**
     * Returns true if a field with the given name \p name is located in this r
     * false otherwise
     */
    bool hasField(const std::string& name) const {
        size_t index = 0;
        return schema()->nameIndex(name, index);
    }

    /**
     * Returns the field with the given name \p name.
     */
    const GenericDatum& field(const std::string& name) const {
        return fieldAt(fieldIndex(name));
    }

    /**
     * Returns the reference to the field with the given name \p name,
     * which can be used to change the contents.
     */
    GenericDatum& field(const std::string& name) {
        return fieldAt(fieldIndex(name));
    }

    /**
     * Returns the field at the given position \p pos.
     */
    const GenericDatum& fieldAt(size_t pos) const {
        return fields_[pos];
    }

    /**
     * Returns the reference to the field at the given position \p pos,
     * which can be used to change the contents.
     */
    GenericDatum& fieldAt(size_t pos) {
        return fields_[pos];
    }

    /**
     * Replaces the field at the given position \p pos with \p v.
     */
    void setFieldAt(size_t pos, const GenericDatum& v) {
        // assertSameType(v, schema()->leafAt(pos));    
        fields_[pos] = v;
    }
}